

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

dgBigVector * __thiscall
dgPolyhedra::FaceNormal
          (dgBigVector *__return_storage_ptr__,dgPolyhedra *this,dgEdge *face,HaF64 *pool,
          HaI32 strideInBytes)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  dgEdge *pdVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  lVar7 = (long)(strideInBytes >> 3);
  lVar8 = face->m_incidentVertex * lVar7;
  dVar1 = (double)pool[lVar8];
  dVar2 = (double)pool[lVar8 + 1];
  dVar3 = (double)pool[lVar8 + 2];
  if (((((ulong)ABS(dVar1) < 0x7ff0000000000000) && ((ulong)ABS(dVar2) < 0x7ff0000000000000)) &&
      (!NAN(dVar2))) && (((ulong)ABS(dVar3) < 0x7ff0000000000000 && (!NAN(dVar3))))) {
    pdVar9 = face->m_next;
    lVar8 = pdVar9->m_incidentVertex * lVar7;
    dVar14 = (double)pool[lVar8 + 1];
    dVar15 = (double)pool[lVar8 + 2];
    if (((((ulong)ABS((double)pool[lVar8]) < 0x7ff0000000000000) &&
         (((ulong)ABS(dVar14) < 0x7ff0000000000000 && (!NAN(dVar14))))) &&
        ((ulong)ABS(dVar15) < 0x7ff0000000000000)) && (!NAN(dVar15))) {
      dVar16 = (double)pool[lVar8] - dVar1;
      auVar10 = ZEXT864((ulong)dVar16);
      auVar12 = ZEXT864((ulong)(dVar14 - dVar2));
      auVar13 = ZEXT864((ulong)(dVar15 - dVar3));
      if (((0x7fefffffffffffff < (long)ABS(dVar16)) ||
          (0x7fefffffffffffff < (long)ABS(dVar14 - dVar2))) ||
         (0x7fefffffffffffff < (long)ABS(dVar15 - dVar3))) {
LAB_0087bb61:
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
      }
      dVar14 = 0.0;
      (__return_storage_ptr__->super_dgTemplateVector<double>).m_x = 0.0;
      (__return_storage_ptr__->super_dgTemplateVector<double>).m_y = 0.0;
      (__return_storage_ptr__->super_dgTemplateVector<double>).m_z = 0.0;
      (__return_storage_ptr__->super_dgTemplateVector<double>).m_w = 0.0;
      pdVar9 = pdVar9->m_next;
      if (pdVar9 == face) {
        dVar16 = 0.0;
        dVar15 = 0.0;
      }
      else {
        dVar15 = 0.0;
        dVar16 = 0.0;
        dVar14 = 0.0;
        do {
          lVar8 = pdVar9->m_incidentVertex * lVar7;
          dVar4 = (double)pool[lVar8 + 1];
          dVar5 = (double)pool[lVar8 + 2];
          if (((0x7fefffffffffffff < (ulong)ABS((double)pool[lVar8])) ||
              (0x7fefffffffffffff < (ulong)ABS(dVar4))) ||
             ((NAN(dVar4) || ((0x7fefffffffffffff < (ulong)ABS(dVar5) || (NAN(dVar5))))))) {
            (__return_storage_ptr__->super_dgTemplateVector<double>).m_x = dVar15;
            (__return_storage_ptr__->super_dgTemplateVector<double>).m_y = dVar16;
            (__return_storage_ptr__->super_dgTemplateVector<double>).m_z = dVar14;
            goto LAB_0087bb31;
          }
          dVar6 = (double)pool[lVar8] - dVar1;
          dVar4 = dVar4 - dVar2;
          dVar5 = dVar5 - dVar3;
          if (((0x7fefffffffffffff < (long)ABS(dVar6)) || (0x7fefffffffffffff < (long)ABS(dVar4)))
             || (0x7fefffffffffffff < (long)ABS(dVar5))) {
            (__return_storage_ptr__->super_dgTemplateVector<double>).m_x = dVar15;
            (__return_storage_ptr__->super_dgTemplateVector<double>).m_y = dVar16;
            (__return_storage_ptr__->super_dgTemplateVector<double>).m_z = dVar14;
            goto LAB_0087bb61;
          }
          auVar19._8_8_ = 0;
          auVar19._0_8_ = dVar5;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = dVar4 * auVar13._0_8_;
          auVar20 = vfmsub231sd_fma(auVar20,auVar12._0_16_,auVar19);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = dVar6;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = dVar5 * auVar10._0_8_;
          auVar21 = vfmsub231sd_fma(auVar21,auVar17,auVar13._0_16_);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = dVar6 * auVar12._0_8_;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = dVar4;
          auVar11 = vfmsub231sd_fma(auVar11,auVar18,auVar10._0_16_);
          dVar15 = auVar20._0_8_ + dVar15;
          dVar16 = auVar21._0_8_ + dVar16;
          dVar14 = auVar11._0_8_ + dVar14;
          pdVar9 = pdVar9->m_next;
          auVar13 = ZEXT1664(auVar19);
          auVar12 = ZEXT1664(auVar18);
          auVar10 = ZEXT1664(auVar17);
        } while (pdVar9 != face);
      }
      (__return_storage_ptr__->super_dgTemplateVector<double>).m_x = dVar15;
      (__return_storage_ptr__->super_dgTemplateVector<double>).m_y = dVar16;
      (__return_storage_ptr__->super_dgTemplateVector<double>).m_z = dVar14;
      return __return_storage_ptr__;
    }
  }
LAB_0087bb31:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x152,"dgBigVector::dgBigVector(const hacd::HaF64 *)");
}

Assistant:

dgBigVector dgPolyhedra::FaceNormal (dgEdge* const face, const hacd::HaF64* const pool, hacd::HaI32 strideInBytes) const
{
	hacd::HaI32 stride = strideInBytes / sizeof (hacd::HaF64);
	dgEdge* edge = face;
	dgBigVector p0 (&pool[edge->m_incidentVertex * stride]);
	edge = edge->m_next;
	dgBigVector p1 (&pool[edge->m_incidentVertex * stride]);
	dgBigVector e1 (p1 - p0);

	dgBigVector normal (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
	for (edge = edge->m_next; edge != face; edge = edge->m_next) {
		dgBigVector p2 (&pool[edge->m_incidentVertex * stride]);
		dgBigVector e2 (p2 - p0);
		normal += e1 * e2;
		e1 = e2;
	} 
	return normal;
}